

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> __thiscall
wabt::MakeUnique<wabt::InvokeAction,wabt::Location&>(wabt *this,Location *args)

{
  size_type sVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  Location local_48;
  
  puVar4 = (undefined8 *)operator_new(0xb0);
  *puVar4 = &PTR__Action_0155dff8;
  sVar1 = (args->filename).size_;
  sVar2 = (args->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&args->field_1 + 8);
  puVar4[1] = (args->filename).data_;
  puVar4[2] = sVar1;
  puVar4[3] = sVar2;
  puVar4[4] = uVar3;
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename.data_ = (char *)0x0;
  local_48.filename.size_._0_4_ = 0;
  local_48.filename.size_._4_4_ = 0;
  Var::Var((Var *)(puVar4 + 5),0xffffffff,&local_48);
  puVar4[0xe] = puVar4 + 0x10;
  puVar4[0xf] = 0;
  *(undefined1 *)(puVar4 + 0x10) = 0;
  *(undefined4 *)(puVar4 + 0x12) = 0;
  *puVar4 = &PTR__InvokeAction_0155df98;
  puVar4[0x13] = 0;
  puVar4[0x14] = 0;
  puVar4[0x15] = 0;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>,_true,_true>)
         (__uniq_ptr_data<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}